

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

bool (anonymous_namespace)::AddBundleExecutable<cmInstallImportedRuntimeArtifactsGenerator*>
               (Helper *helper,cmInstallRuntimeDependencySet *runtimeDependencySet,
               cmInstallImportedRuntimeArtifactsGenerator **bundleExecutable)

{
  cmInstallRuntimeDependencySet *this;
  bool bVar1;
  allocator<char> local_49;
  string local_48;
  cmInstallImportedRuntimeArtifactsGenerator **local_28;
  cmInstallImportedRuntimeArtifactsGenerator **bundleExecutable_local;
  cmInstallRuntimeDependencySet *runtimeDependencySet_local;
  Helper *helper_local;
  
  local_28 = bundleExecutable;
  bundleExecutable_local = (cmInstallImportedRuntimeArtifactsGenerator **)runtimeDependencySet;
  runtimeDependencySet_local = (cmInstallRuntimeDependencySet *)helper;
  bVar1 = cmInstallRuntimeDependencySet::AddBundleExecutable(runtimeDependencySet,*bundleExecutable)
  ;
  this = runtimeDependencySet_local;
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"A runtime dependency set may only have one bundle executable.",
               &local_49);
    anon_unknown.dwarf_7427e9::Helper::SetError((Helper *)this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return bVar1;
}

Assistant:

bool AddBundleExecutable(Helper& helper,
                         cmInstallRuntimeDependencySet* runtimeDependencySet,
                         T&& bundleExecutable)
{
  if (!runtimeDependencySet->AddBundleExecutable(bundleExecutable)) {
    helper.SetError(
      "A runtime dependency set may only have one bundle executable.");
    return false;
  }
  return true;
}